

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O0

int CfdGetTapBranchCount(void *handle,void *tree_handle,uint32_t *branch_count)

{
  bool bVar1;
  reference this;
  size_type sVar2;
  reference this_00;
  undefined4 *in_RDX;
  long in_RSI;
  string *in_stack_00000028;
  void *in_stack_00000030;
  CfdException *except;
  exception *std_except;
  uint32_t count;
  CfdCapiTapscriptTree *buffer;
  int result;
  size_type in_stack_ffffffffffffff18;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *in_stack_ffffffffffffff20;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *in_stack_ffffffffffffff30;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> local_a0;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> local_88;
  undefined4 local_6c;
  long local_68;
  allocator local_59;
  string local_58 [52];
  undefined4 local_24;
  undefined4 *local_20;
  long local_18;
  
  local_24 = 0xffffffff;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"TapscriptTree",&local_59);
  cfd::capi::CheckBuffer(in_stack_00000030,in_stack_00000028);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_68 = local_18;
  bVar1 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::empty
                    (*(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
                      (local_18 + 0x18));
  if (bVar1) {
    this_00 = std::
              vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::
              at((vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                  *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    cfd::core::TapBranch::GetBranchList(&local_a0,&this_00->super_TapBranch);
    sVar2 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::size
                      (&local_a0);
    local_6c = (undefined4)sVar2;
    std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
              (in_stack_ffffffffffffff30);
  }
  else {
    this = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at
                     (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    cfd::core::TapBranch::GetBranchList(&local_88,this);
    sVar2 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::size
                      (&local_88);
    local_6c = (undefined4)sVar2;
    std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
              (in_stack_ffffffffffffff30);
  }
  if (local_20 != (undefined4 *)0x0) {
    *local_20 = local_6c;
  }
  return 0;
}

Assistant:

int CfdGetTapBranchCount(
    void* handle, void* tree_handle, uint32_t* branch_count) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    uint32_t count;
    if (!buffer->branch_buffer->empty()) {
      count = static_cast<uint32_t>(
          buffer->branch_buffer->at(0).GetBranchList().size());
    } else {
      count = static_cast<uint32_t>(
          buffer->tree_buffer->at(0).GetBranchList().size());
    }

    if (branch_count != nullptr) *branch_count = count;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}